

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  LogType local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  undefined4 local_8c;
  char local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  char local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  char local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  char local_58 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  char local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  char local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  char local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  iVar2 = 0x1052e8;
  puts("Rates are in Messages per second");
  uVar1 = Benchmark(iVar2);
  iVar2 = 0x105020;
  printf("           Empty: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x105036;
  printf("   EmptyStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("      EmptyTrace: %d\n",(ulong)uVar1);
  putchar(10);
  std::make_shared<liblogger::LogFile,char_const(&)[10]>((char (*) [10])local_a8);
  p_Var4 = a_Stack_a0;
  local_28 = (char  [8])local_a8;
  _Stack_20._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add(local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x105062;
  printf("         LogFile: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x105078;
  printf(" LogFileStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogFileTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  std::make_shared<liblogger::LogPipe,char_const(&)[16]>((char (*) [16])local_a8);
  p_Var4 = a_Stack_a0;
  local_38 = (char  [8])local_a8;
  _Stack_30._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add(local_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_30);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x1050b4;
  printf("         LogPipe: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1050ca;
  printf(" LogPipeStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogPipeTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  local_8c = 100;
  std::make_shared<liblogger::LogTail,int>((int *)local_a8);
  p_Var4 = a_Stack_a0;
  local_48 = (char  [8])local_a8;
  _Stack_40._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::Add(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x1050f6;
  printf("         LogTail: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x10510c;
  printf(" LogTailStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("    LogTailTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::RemoveAll();
  std::make_shared<liblogger::LogFilterDup>();
  p_Var4 = a_Stack_a0;
  local_58 = (char  [8])local_a8;
  _Stack_50._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd(local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x105138;
  printf("        LogFilterDup: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x105152;
  printf("LogFilterDupStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterDupTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  local_8c = 5;
  std::make_shared<liblogger::LogFilterType,liblogger::LogType>(local_a8);
  p_Var4 = a_Stack_a0;
  local_68 = (char  [8])local_a8;
  _Stack_60._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd(local_68);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x105186;
  printf("        LogFilterType: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1051a1;
  printf("LogFilterTypeStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterTypeTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  std::make_shared<liblogger::LogFilterContains,char_const(&)[6]>((char (*) [6])local_a8);
  p_Var4 = a_Stack_a0;
  local_78 = (char  [8])local_a8;
  _Stack_70._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd(local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_70);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x1051dd;
  printf("        LogFilterContains: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x1051fc;
  printf("LogFilterContainsStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterContainsTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  std::make_shared<liblogger::LogFilterRegex,char_const(&)[13]>((char (*) [13])local_a8);
  p_Var4 = a_Stack_a0;
  local_88 = (char  [8])local_a8;
  _Stack_80._M_pi = a_Stack_a0[0]._M_pi;
  local_a8 = (LogType  [2])0x0;
  a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  liblogger::LogManager::FilterAdd(local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(p_Var4);
  uVar1 = Benchmark((int)p_Var4);
  iVar2 = 0x105247;
  printf("        LogFilterRegex: %d\n",(ulong)uVar1);
  iVar2 = BenchmarkStreamer(iVar2);
  iVar3 = 0x105263;
  printf("LogFilterRegexStreamer: %d\n");
  uVar1 = BenchmarkTrace(iVar3,iVar2);
  printf("   LogFilterRegexTrace: %d\n",(ulong)uVar1);
  putchar(10);
  liblogger::LogManager::FilterRemoveAll();
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
    int count = 100000;
    int trace = 100;
	//LogManager::Add();

    printf("Rates are in Messages per second\n");
	printf("           Empty: %d\n", Benchmark(count));
    printf("   EmptyStreamer: %d\n", BenchmarkStreamer(count));
    printf("      EmptyTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");

    LogManager::Add(std::make_shared<LogFile>("/dev/null"));
    printf("         LogFile: %d\n", Benchmark(count));
    printf(" LogFileStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogFileTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogPipe>("cat > /dev/null"));
    printf("         LogPipe: %d\n", Benchmark(count));
    printf(" LogPipeStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogPipeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::Add(std::make_shared<LogTail>(100));
    printf("         LogTail: %d\n", Benchmark(count));
    printf(" LogTailStreamer: %d\n", BenchmarkStreamer(count));
    printf("    LogTailTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::RemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterDup>());
    printf("        LogFilterDup: %d\n", Benchmark(count));
    printf("LogFilterDupStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterDupTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterType>(LOGGER_CRIT));
    printf("        LogFilterType: %d\n", Benchmark(count));
    printf("LogFilterTypeStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterTypeTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterContains>("World"));
    printf("        LogFilterContains: %d\n", Benchmark(count));
    printf("LogFilterContainsStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterContainsTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();

    LogManager::FilterAdd(std::make_shared<LogFilterRegex>("/somefilter/"));
    printf("        LogFilterRegex: %d\n", Benchmark(count));
    printf("LogFilterRegexStreamer: %d\n", BenchmarkStreamer(count));
    printf("   LogFilterRegexTrace: %d\n", BenchmarkTrace(count / trace, trace));
    printf("\n");
	LogManager::FilterRemoveAll();



	return 0;
}